

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O1

int nifti_free_extensions(nifti_image *nim)

{
  uint uVar1;
  void *__ptr;
  long lVar2;
  long lVar3;
  
  if (nim == (nifti_image *)0x0) {
    return -1;
  }
  uVar1 = nim->num_ext;
  if ((int)uVar1 < 1) {
LAB_00112668:
    if (nim->ext_list == (nifti1_extension *)0x0) goto LAB_0011267b;
  }
  else {
    if (nim->ext_list != (nifti1_extension *)0x0) {
      if (0 < nim->num_ext) {
        lVar3 = 8;
        lVar2 = 0;
        do {
          __ptr = *(void **)((long)&nim->ext_list->esize + lVar3);
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 0x10;
        } while (lVar2 < nim->num_ext);
      }
      free(nim->ext_list);
      goto LAB_0011267b;
    }
    if ((int)uVar1 < 1) goto LAB_00112668;
  }
  if (0 < g_opts_0) {
    fprintf(_stderr,"** warning: nifti extension num/ptr mismatch (%d,%p)\n",(ulong)uVar1,
            nim->ext_list);
  }
LAB_0011267b:
  if (2 < g_opts_0) {
    nifti_free_extensions_cold_1();
  }
  nim->num_ext = 0;
  nim->ext_list = (nifti1_extension *)0x0;
  return 0;
}

Assistant:

int nifti_free_extensions( nifti_image *nim )
{
   int c ;
   if( nim == NULL ) return -1;
   if( nim->num_ext > 0 && nim->ext_list ){
      for( c = 0; c < nim->num_ext; c++ )
         if ( nim->ext_list[c].edata ) free(nim->ext_list[c].edata);
      free(nim->ext_list);
   }
   /* or if it is inconsistent, warn the user (if we are not in quiet mode) */
   else if ( (nim->num_ext > 0 || nim->ext_list != NULL) && (g_opts.debug > 0) )
      fprintf(stderr,"** warning: nifti extension num/ptr mismatch (%d,%p)\n",
              nim->num_ext, (void *)nim->ext_list);

   if( g_opts.debug > 2 )
      fprintf(stderr,"+d free'd %d extension(s)\n", nim->num_ext);

   nim->num_ext = 0;
   nim->ext_list = NULL;

   return 0;
}